

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint Kit_DsdGetSupports_rec(Kit_DsdNtk_t *p,int iLit)

{
  int Id;
  uint uVar1;
  Kit_DsdObj_t *pKVar2;
  uint uVar3;
  ulong uVar4;
  
  Id = Abc_Lit2Var(iLit);
  pKVar2 = Kit_DsdNtkObj(p,Id);
  if (pKVar2 == (Kit_DsdObj_t *)0x0) {
    uVar3 = Kit_DsdLitSupport(p,iLit);
    return uVar3;
  }
  uVar3 = 0;
  for (uVar4 = 0; uVar4 < (uint)*pKVar2 >> 0x1a; uVar4 = uVar4 + 1) {
    uVar1 = Kit_DsdGetSupports_rec(p,(uint)*(ushort *)(&pKVar2[1].field_0x0 + uVar4 * 2));
    uVar3 = uVar3 | uVar1;
  }
  p->pSupps[(ulong)((uint)*pKVar2 & 0x3f) - (ulong)p->nVars] = uVar3;
  if (uVar3 < 0x10000) {
    return uVar3;
  }
  __assert_fail("uSupport <= 0xFFFF",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                ,0x6d4,"unsigned int Kit_DsdGetSupports_rec(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned Kit_DsdGetSupports_rec( Kit_DsdNtk_t * p, int iLit )
{
    Kit_DsdObj_t * pObj;
    unsigned uSupport, k;
    int iFaninLit;
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return Kit_DsdLitSupport( p, iLit );
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        uSupport |= Kit_DsdGetSupports_rec( p, iFaninLit );
    p->pSupps[pObj->Id - p->nVars] = uSupport;
    assert( uSupport <= 0xFFFF );
    return uSupport;
}